

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
edition_unittest::EnumParseTester::_InternalSerialize
          (EnumParseTester *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  int *piVar1;
  int iVar2;
  LongSooRep *pLVar3;
  int *piVar4;
  uint8_t *puVar5;
  byte *extraout_RAX;
  byte *extraout_RAX_00;
  byte *extraout_RAX_01;
  byte *extraout_RAX_02;
  byte *extraout_RAX_03;
  byte *extraout_RAX_04;
  byte *extraout_RAX_05;
  byte *extraout_RAX_06;
  byte *extraout_RAX_07;
  byte *extraout_RAX_08;
  byte *extraout_RAX_09;
  byte *extraout_RAX_10;
  byte *extraout_RAX_11;
  byte *extraout_RAX_12;
  byte *extraout_RAX_13;
  byte *extraout_RAX_14;
  byte *extraout_RAX_15;
  byte *extraout_RAX_16;
  byte *extraout_RAX_17;
  byte *extraout_RAX_18;
  byte *extraout_RAX_19;
  byte *extraout_RAX_20;
  byte *extraout_RAX_21;
  byte *pbVar6;
  byte *extraout_RAX_22;
  ulong in_RCX;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  LongSooRep *unaff_R13;
  byte *pbVar12;
  bool bVar13;
  
  uVar10 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar10 & 1) == 0) goto LAB_00c4c6e2;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  in_RCX = (ulong)(this->field_0)._impl_.optional_seq_small_0_lowfield_;
  pbVar6 = target + 1;
  *target = '\b';
  uVar7 = in_RCX;
  if (0x7f < in_RCX) goto LAB_00c4e42a;
  do {
    *pbVar6 = (byte)in_RCX;
    target = pbVar6 + 1;
LAB_00c4c6e2:
    uVar9 = *(uint *)((long)&this->field_0 + 0x30);
    if (uVar9 == 0) {
LAB_00c4c7ad:
      uVar11 = *(uint *)((long)&this->field_0 + 0x48);
      if (uVar11 == 0) goto LAB_00c4c878;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_small_0_lowfield_;
        *target = 0x1a;
        pbVar6 = target + 1;
        uVar9 = uVar11;
        if (0x7f < uVar11) goto LAB_00c4de3d;
        goto LAB_00c4c7e8;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_00;
LAB_00c4de7f:
      do {
        target = pbVar6;
        *target = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar6 = target + 1;
        bVar13 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar13);
LAB_00c4c8e9:
      *pbVar6 = (byte)uVar9;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_small_1_lowfield_.soo_rep_.field_0 + 8)
        ;
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = target + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4c979:
      uVar11 = *(uint *)((long)&this->field_0 + 0x78);
      if (uVar11 == 0) goto LAB_00c4ca4a;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_small_1_lowfield_;
        *target = 0x32;
        pbVar6 = target + 1;
        uVar9 = uVar11;
        if (0x7f < uVar11) goto LAB_00c4dec1;
        goto LAB_00c4c9b7;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_02;
LAB_00c4df03:
      do {
        target = pbVar6;
        *target = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar6 = target + 1;
        bVar13 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar13);
LAB_00c4cac0:
      *pbVar6 = (byte)uVar9;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_large_lowfield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = target + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4cb53:
      uVar11 = *(uint *)((long)&this->field_0 + 0xa8);
      if (uVar11 == 0) goto LAB_00c4cc27;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_large_lowfield_;
        *target = 0x4a;
        pbVar6 = target + 1;
        uVar9 = uVar11;
        if (0x7f < uVar11) goto LAB_00c4df45;
        goto LAB_00c4cb94;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_04;
LAB_00c4df87:
      do {
        target = pbVar6;
        *target = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar6 = target + 1;
        bVar13 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar13);
LAB_00c4cc9e:
      *pbVar6 = (byte)uVar9;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_arbitrary_lowfield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = target + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4cd31:
      uVar11 = *(uint *)((long)&this->field_0 + 0xd8);
      if (uVar11 == 0) goto LAB_00c4ce05;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_arbitrary_lowfield_;
        *target = 0x62;
        pbVar6 = target + 1;
        uVar9 = uVar11;
        if (0x7f < uVar11) goto LAB_00c4dfc9;
        goto LAB_00c4cd72;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_06;
LAB_00c4e00b:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar13);
LAB_00c4cebb:
      *pbVar6 = (byte)uVar9;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_small_0_midfield_.soo_rep_.field_0 + 8)
        ;
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4cf4e:
      uVar11 = *(uint *)((long)&this->field_0 + 0x108);
      if (uVar11 == 0) goto LAB_00c4d027;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_small_0_midfield_;
        target[0] = 0xda;
        target[1] = 0x3e;
        pbVar6 = target + 2;
        uVar9 = uVar11;
        if (0x7f < uVar11) goto LAB_00c4e04d;
        pbVar12 = target + 1;
        goto LAB_00c4cf94;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_08;
LAB_00c4e08f:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar13);
LAB_00c4d0a5:
      *pbVar6 = (byte)uVar9;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_small_1_midfield_.soo_rep_.field_0 + 8)
        ;
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4d138:
      uVar11 = *(uint *)((long)&this->field_0 + 0x138);
      if (uVar11 == 0) goto LAB_00c4d211;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_small_1_midfield_;
        target[0] = 0xf2;
        target[1] = 0x3e;
        pbVar6 = target + 2;
        uVar9 = uVar11;
        if (0x7f < uVar11) goto LAB_00c4e0d1;
        pbVar12 = target + 1;
        goto LAB_00c4d17e;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_10;
LAB_00c4e113:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar13);
LAB_00c4d28f:
      *pbVar6 = (byte)uVar9;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_large_midfield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4d322:
      uVar11 = *(uint *)((long)&this->field_0 + 0x168);
      if (uVar11 == 0) goto LAB_00c4d3fb;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_large_midfield_;
        target[0] = 0x8a;
        target[1] = 0x3f;
        pbVar6 = target + 2;
        uVar9 = uVar11;
        if (0x7f < uVar11) goto LAB_00c4e155;
        pbVar12 = target + 1;
        goto LAB_00c4d368;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_12;
LAB_00c4e197:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar13);
LAB_00c4d479:
      *pbVar6 = (byte)uVar9;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_arbitrary_midfield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4d50c:
      uVar11 = *(uint *)((long)&this->field_0 + 0x198);
      if (uVar11 == 0) goto LAB_00c4d5e5;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_arbitrary_midfield_;
        target[0] = 0xa2;
        target[1] = 0x3f;
        pbVar6 = target + 2;
        uVar9 = uVar11;
        if (0x7f < uVar11) goto LAB_00c4e1d9;
        pbVar12 = target + 1;
        goto LAB_00c4d552;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_14;
LAB_00c4e21b:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar13);
LAB_00c4d666:
      *pbVar6 = (byte)uVar9;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_small_0_hifield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4d6f9:
      uVar11 = *(uint *)((long)&this->field_0 + 0x1c8);
      if (uVar11 == 0) goto LAB_00c4d7d4;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_small_0_hifield_;
        target[0] = 0x9a;
        target[1] = 0xa4;
        target[2] = 0xe8;
        target[3] = 3;
        pbVar6 = target + 4;
        uVar9 = uVar11;
        if (0x7f < uVar11) goto LAB_00c4e25d;
        pbVar12 = target + 3;
        goto LAB_00c4d741;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_16;
LAB_00c4e29f:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar13);
LAB_00c4d855:
      *pbVar6 = (byte)uVar9;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_small_1_hifield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4d8e8:
      uVar11 = *(uint *)((long)&this->field_0 + 0x1f8);
      if (uVar11 == 0) goto LAB_00c4d9c3;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_small_1_hifield_;
        target[0] = 0xb2;
        target[1] = 0xa4;
        target[2] = 0xe8;
        target[3] = 3;
        pbVar6 = target + 4;
        uVar9 = uVar11;
        if (0x7f < uVar11) goto LAB_00c4e2e1;
        pbVar12 = target + 3;
        goto LAB_00c4d930;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_18;
LAB_00c4e323:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar13);
LAB_00c4da44:
      *pbVar6 = (byte)uVar9;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_seq_large_hifield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4dad7:
      uVar11 = *(uint *)((long)&this->field_0 + 0x228);
      if (uVar11 == 0) goto LAB_00c4dbb2;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_seq_large_hifield_;
        target[0] = 0xca;
        target[1] = 0xa4;
        target[2] = 0xe8;
        target[3] = 3;
        pbVar6 = target + 4;
        uVar9 = uVar11;
        if (0x7f < uVar11) goto LAB_00c4e365;
        pbVar12 = target + 3;
        goto LAB_00c4db1f;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_20;
LAB_00c4e3a7:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar10 | 0x80;
        uVar9 = uVar10 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar10;
        uVar10 = uVar9;
      } while (bVar13);
LAB_00c4dc31:
      *pbVar6 = (byte)uVar9;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_arbitrary_hifield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
    }
    else {
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        this_00 = &(this->field_0)._impl_.repeated_seq_small_0_lowfield_;
        *target = 0x12;
        pbVar6 = target + 1;
        uVar11 = uVar9;
        if (0x7f < uVar9) {
          do {
            target = pbVar6;
            *target = (byte)uVar11 | 0x80;
            uVar9 = uVar11 >> 7;
            pbVar6 = target + 1;
            bVar13 = 0x3fff < uVar11;
            uVar11 = uVar9;
          } while (bVar13);
        }
        *pbVar6 = (byte)uVar9;
        if ((undefined1  [16])
            ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
            (undefined1  [16])0x0) {
          pLVar3 = (LongSooRep *)
                   ((long)&(this->field_0)._impl_.repeated_seq_small_0_lowfield_.soo_rep_.field_0 +
                   8);
          bVar13 = true;
        }
        else {
          pLVar3 = (LongSooRep *)
                   google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
          bVar13 = (undefined1  [16])
                   ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                   (undefined1  [16])0x0;
        }
        target = target + 2;
        iVar2 = google::protobuf::internal::SooRep::size(&this_00->soo_rep_,bVar13);
        unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
        do {
          if (stream->end_ <= target) {
            target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
          }
          in_RCX = (ulong)(int)pLVar3->elements_int;
          uVar7 = in_RCX;
          if (0x7f < in_RCX) {
            do {
              *target = (byte)uVar7 | 0x80;
              in_RCX = uVar7 >> 7;
              target = target + 1;
              bVar13 = 0x3fff < uVar7;
              uVar7 = in_RCX;
            } while (bVar13);
          }
          pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
          *target = (byte)in_RCX;
          target = target + 1;
        } while (pLVar3 < unaff_R13);
        goto LAB_00c4c7ad;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX;
LAB_00c4de3d:
      do {
        target = pbVar6;
        *target = (byte)uVar9 | 0x80;
        uVar11 = uVar9 >> 7;
        pbVar6 = target + 1;
        bVar13 = 0x3fff < uVar9;
        uVar9 = uVar11;
      } while (bVar13);
LAB_00c4c7e8:
      *pbVar6 = (byte)uVar11;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_small_0_lowfield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = target + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4c878:
      if ((uVar10 & 2) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(this->field_0)._impl_.optional_seq_small_1_lowfield_;
        pbVar6 = target + 1;
        *target = 0x20;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar6 = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        *pbVar6 = (byte)in_RCX;
        target = pbVar6 + 1;
      }
      uVar9 = *(uint *)((long)&this->field_0 + 0x60);
      if (uVar9 == 0) goto LAB_00c4c979;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_small_1_lowfield_;
        *target = 0x2a;
        pbVar6 = target + 1;
        uVar11 = uVar9;
        if (0x7f < uVar9) goto LAB_00c4de7f;
        goto LAB_00c4c8e9;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_01;
LAB_00c4dec1:
      do {
        target = pbVar6;
        *target = (byte)uVar9 | 0x80;
        uVar11 = uVar9 >> 7;
        pbVar6 = target + 1;
        bVar13 = 0x3fff < uVar9;
        uVar9 = uVar11;
      } while (bVar13);
LAB_00c4c9b7:
      *pbVar6 = (byte)uVar11;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_small_1_lowfield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = target + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4ca4a:
      if ((char)uVar10 < '\0') {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(this->field_0)._impl_.optional_seq_large_lowfield_;
        pbVar6 = target + 1;
        *target = 0x38;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar6 = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        *pbVar6 = (byte)in_RCX;
        target = pbVar6 + 1;
      }
      uVar9 = *(uint *)((long)&this->field_0 + 0x90);
      if (uVar9 == 0) goto LAB_00c4cb53;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_large_lowfield_;
        *target = 0x42;
        pbVar6 = target + 1;
        uVar11 = uVar9;
        if (0x7f < uVar9) goto LAB_00c4df03;
        goto LAB_00c4cac0;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_03;
LAB_00c4df45:
      do {
        target = pbVar6;
        *target = (byte)uVar9 | 0x80;
        uVar11 = uVar9 >> 7;
        pbVar6 = target + 1;
        bVar13 = 0x3fff < uVar9;
        uVar9 = uVar11;
      } while (bVar13);
LAB_00c4cb94:
      *pbVar6 = (byte)uVar11;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_large_lowfield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = target + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4cc27:
      if ((uVar10 >> 8 & 1) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(this->field_0)._impl_.optional_arbitrary_lowfield_;
        pbVar6 = target + 1;
        *target = 0x50;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar6 = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        *pbVar6 = (byte)in_RCX;
        target = pbVar6 + 1;
      }
      uVar9 = *(uint *)((long)&this->field_0 + 0xc0);
      if (uVar9 == 0) goto LAB_00c4cd31;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_arbitrary_lowfield_;
        *target = 0x5a;
        pbVar6 = target + 1;
        uVar11 = uVar9;
        if (0x7f < uVar9) goto LAB_00c4df87;
        goto LAB_00c4cc9e;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_05;
LAB_00c4dfc9:
      do {
        target = pbVar6;
        *target = (byte)uVar9 | 0x80;
        uVar11 = uVar9 >> 7;
        pbVar6 = target + 1;
        bVar13 = 0x3fff < uVar9;
        uVar9 = uVar11;
      } while (bVar13);
LAB_00c4cd72:
      *pbVar6 = (byte)uVar11;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_arbitrary_lowfield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = target + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4ce05:
      if ((uVar10 & 4) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(this->field_0)._impl_.other_field_;
        pbVar6 = target + 2;
        target[0] = 0x98;
        target[1] = 6;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar6 = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        *pbVar6 = (byte)in_RCX;
        target = pbVar6 + 1;
      }
      if ((uVar10 & 8) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(this->field_0)._impl_.optional_seq_small_0_midfield_;
        pbVar6 = target + 2;
        target[0] = 200;
        target[1] = 0x3e;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar6 = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        *pbVar6 = (byte)in_RCX;
        target = pbVar6 + 1;
      }
      uVar9 = *(uint *)((long)&this->field_0 + 0xf0);
      if (uVar9 == 0) goto LAB_00c4cf4e;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_small_0_midfield_;
        target[0] = 0xd2;
        target[1] = 0x3e;
        pbVar6 = target + 2;
        uVar11 = uVar9;
        if (0x7f < uVar9) goto LAB_00c4e00b;
        pbVar12 = target + 1;
        goto LAB_00c4cebb;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_07;
LAB_00c4e04d:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar9 | 0x80;
        uVar11 = uVar9 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar9;
        uVar9 = uVar11;
      } while (bVar13);
LAB_00c4cf94:
      *pbVar6 = (byte)uVar11;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_small_0_midfield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4d027:
      if ((uVar10 & 0x40) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(this->field_0)._impl_.optional_seq_small_1_midfield_;
        pbVar6 = target + 2;
        target[0] = 0xe0;
        target[1] = 0x3e;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar6 = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        *pbVar6 = (byte)in_RCX;
        target = pbVar6 + 1;
      }
      uVar9 = *(uint *)((long)&this->field_0 + 0x120);
      if (uVar9 == 0) goto LAB_00c4d138;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_small_1_midfield_;
        target[0] = 0xea;
        target[1] = 0x3e;
        pbVar6 = target + 2;
        uVar11 = uVar9;
        if (0x7f < uVar9) goto LAB_00c4e08f;
        pbVar12 = target + 1;
        goto LAB_00c4d0a5;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_09;
LAB_00c4e0d1:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar9 | 0x80;
        uVar11 = uVar9 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar9;
        uVar9 = uVar11;
      } while (bVar13);
LAB_00c4d17e:
      *pbVar6 = (byte)uVar11;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_small_1_midfield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4d211:
      if ((uVar10 >> 9 & 1) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(this->field_0)._impl_.optional_seq_large_midfield_;
        pbVar6 = target + 2;
        target[0] = 0xf8;
        target[1] = 0x3e;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar6 = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        *pbVar6 = (byte)in_RCX;
        target = pbVar6 + 1;
      }
      uVar9 = *(uint *)((long)&this->field_0 + 0x150);
      if (uVar9 == 0) goto LAB_00c4d322;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_large_midfield_;
        target[0] = 0x82;
        target[1] = 0x3f;
        pbVar6 = target + 2;
        uVar11 = uVar9;
        if (0x7f < uVar9) goto LAB_00c4e113;
        pbVar12 = target + 1;
        goto LAB_00c4d28f;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_11;
LAB_00c4e155:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar9 | 0x80;
        uVar11 = uVar9 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar9;
        uVar9 = uVar11;
      } while (bVar13);
LAB_00c4d368:
      *pbVar6 = (byte)uVar11;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_large_midfield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4d3fb:
      if ((uVar10 >> 10 & 1) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(this->field_0)._impl_.optional_arbitrary_midfield_;
        pbVar6 = target + 2;
        target[0] = 0x90;
        target[1] = 0x3f;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar6 = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        *pbVar6 = (byte)in_RCX;
        target = pbVar6 + 1;
      }
      uVar9 = *(uint *)((long)&this->field_0 + 0x180);
      if (uVar9 == 0) goto LAB_00c4d50c;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_arbitrary_midfield_;
        target[0] = 0x9a;
        target[1] = 0x3f;
        pbVar6 = target + 2;
        uVar11 = uVar9;
        if (0x7f < uVar9) goto LAB_00c4e197;
        pbVar12 = target + 1;
        goto LAB_00c4d479;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_13;
LAB_00c4e1d9:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar9 | 0x80;
        uVar11 = uVar9 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar9;
        uVar9 = uVar11;
      } while (bVar13);
LAB_00c4d552:
      *pbVar6 = (byte)uVar11;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_arbitrary_midfield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4d5e5:
      if ((uVar10 & 0x10) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(this->field_0)._impl_.optional_seq_small_0_hifield_;
        pbVar6 = target + 4;
        target[0] = 0x88;
        target[1] = 0xa4;
        target[2] = 0xe8;
        target[3] = 3;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar6 = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        *pbVar6 = (byte)in_RCX;
        target = pbVar6 + 1;
      }
      uVar9 = *(uint *)((long)&this->field_0 + 0x1b0);
      if (uVar9 == 0) goto LAB_00c4d6f9;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_small_0_hifield_;
        target[0] = 0x92;
        target[1] = 0xa4;
        target[2] = 0xe8;
        target[3] = 3;
        pbVar6 = target + 4;
        uVar11 = uVar9;
        if (0x7f < uVar9) goto LAB_00c4e21b;
        pbVar12 = target + 3;
        goto LAB_00c4d666;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_15;
LAB_00c4e25d:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar9 | 0x80;
        uVar11 = uVar9 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar9;
        uVar9 = uVar11;
      } while (bVar13);
LAB_00c4d741:
      *pbVar6 = (byte)uVar11;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_small_0_hifield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4d7d4:
      if ((uVar10 & 0x20) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(this->field_0)._impl_.optional_seq_small_1_hifield_;
        pbVar6 = target + 4;
        target[0] = 0xa0;
        target[1] = 0xa4;
        target[2] = 0xe8;
        target[3] = 3;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar6 = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        *pbVar6 = (byte)in_RCX;
        target = pbVar6 + 1;
      }
      uVar9 = *(uint *)((long)&this->field_0 + 0x1e0);
      if (uVar9 == 0) goto LAB_00c4d8e8;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_small_1_hifield_;
        target[0] = 0xaa;
        target[1] = 0xa4;
        target[2] = 0xe8;
        target[3] = 3;
        pbVar6 = target + 4;
        uVar11 = uVar9;
        if (0x7f < uVar9) goto LAB_00c4e29f;
        pbVar12 = target + 3;
        goto LAB_00c4d855;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_17;
LAB_00c4e2e1:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar9 | 0x80;
        uVar11 = uVar9 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar9;
        uVar9 = uVar11;
      } while (bVar13);
LAB_00c4d930:
      *pbVar6 = (byte)uVar11;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_small_1_hifield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4d9c3:
      if ((uVar10 >> 0xb & 1) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(this->field_0)._impl_.optional_seq_large_hifield_;
        pbVar6 = target + 4;
        target[0] = 0xb8;
        target[1] = 0xa4;
        target[2] = 0xe8;
        target[3] = 3;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar6 = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        *pbVar6 = (byte)in_RCX;
        target = pbVar6 + 1;
      }
      uVar9 = *(uint *)((long)&this->field_0 + 0x210);
      if (uVar9 == 0) goto LAB_00c4dad7;
      pbVar6 = stream->end_;
      if (pbVar6 <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        pbVar6 = stream->end_;
      }
      if (target < pbVar6) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_seq_large_hifield_;
        target[0] = 0xc2;
        target[1] = 0xa4;
        target[2] = 0xe8;
        target[3] = 3;
        pbVar6 = target + 4;
        uVar11 = uVar9;
        if (0x7f < uVar9) goto LAB_00c4e323;
        pbVar12 = target + 3;
        goto LAB_00c4da44;
      }
      _InternalSerialize();
      pbVar6 = extraout_RAX_19;
LAB_00c4e365:
      do {
        pbVar12 = pbVar6;
        *pbVar12 = (byte)uVar9 | 0x80;
        uVar11 = uVar9 >> 7;
        pbVar6 = pbVar12 + 1;
        bVar13 = 0x3fff < uVar9;
        uVar9 = uVar11;
      } while (bVar13);
LAB_00c4db1f:
      *pbVar6 = (byte)uVar11;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar3 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_seq_large_hifield_.soo_rep_.field_0 + 8);
        bVar13 = true;
      }
      else {
        pLVar3 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      unaff_R13 = (LongSooRep *)((long)&pLVar3->elements_int + (long)iVar2 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(int)pLVar3->elements_int;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *target = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        pLVar3 = (LongSooRep *)((long)&pLVar3->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar3 < unaff_R13);
LAB_00c4dbb2:
      if ((uVar10 >> 0xc & 1) != 0) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (ulong)(this->field_0)._impl_.optional_arbitrary_hifield_;
        pbVar6 = target + 4;
        target[0] = 0xd0;
        target[1] = 0xa4;
        target[2] = 0xe8;
        target[3] = 3;
        uVar7 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar6 = (byte)uVar7 | 0x80;
            in_RCX = uVar7 >> 7;
            pbVar6 = pbVar6 + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = in_RCX;
          } while (bVar13);
        }
        *pbVar6 = (byte)in_RCX;
        target = pbVar6 + 1;
      }
      uVar9 = *(uint *)((long)&this->field_0 + 0x240);
      if (uVar9 != 0) {
        pbVar6 = stream->end_;
        if (pbVar6 <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
          pbVar6 = stream->end_;
        }
        if (target < pbVar6) {
          unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_arbitrary_hifield_;
          target[0] = 0xda;
          target[1] = 0xa4;
          target[2] = 0xe8;
          target[3] = 3;
          pbVar6 = target + 4;
          uVar10 = uVar9;
          if (0x7f < uVar9) goto LAB_00c4e3a7;
          pbVar12 = target + 3;
          goto LAB_00c4dc31;
        }
        _InternalSerialize();
        pbVar6 = extraout_RAX_21;
        goto LAB_00c4e3e7;
      }
    }
    uVar10 = *(uint *)((long)&this->field_0 + 600);
    if (uVar10 == 0) goto LAB_00c4dd9d;
    pbVar6 = stream->end_;
    if (pbVar6 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar6 = stream->end_;
    }
    if (target < pbVar6) {
      unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_arbitrary_hifield_;
      target[0] = 0xe2;
      target[1] = 0xa4;
      target[2] = 0xe8;
      target[3] = 3;
      pbVar6 = target + 4;
      uVar9 = uVar10;
      if (uVar10 < 0x80) {
        pbVar12 = target + 3;
      }
      else {
LAB_00c4e3e7:
        do {
          pbVar12 = pbVar6;
          *pbVar12 = (byte)uVar9 | 0x80;
          uVar10 = uVar9 >> 7;
          pbVar6 = pbVar12 + 1;
          bVar13 = 0x3fff < uVar9;
          uVar9 = uVar10;
        } while (bVar13);
      }
      *pbVar6 = (byte)uVar10;
      if ((unaff_R13->elements_int & 4) == 0) {
        piVar4 = (int *)((long)&this->field_0 + 0x250);
        bVar13 = true;
      }
      else {
        piVar4 = (int *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        bVar13 = (unaff_R13->elements_int & 4) == 0;
      }
      target = pbVar12 + 2;
      iVar2 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar13);
      piVar1 = piVar4 + iVar2;
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        uVar8 = (ulong)*piVar4;
        uVar7 = uVar8;
        if (0x7f < uVar8) {
          do {
            *target = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            target = target + 1;
            bVar13 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar13);
        }
        piVar4 = piVar4 + 1;
        *target = (byte)uVar8;
        target = target + 1;
      } while (piVar4 < piVar1);
LAB_00c4dd9d:
      if (*(short *)((long)&this->field_0 + 10) != 0) {
        target = google::protobuf::internal::ExtensionSet::_InternalSerializeAllImpl
                           (&(this->field_0)._impl_._extensions_,
                            (MessageLite *)_EnumParseTester_default_instance_,target,stream);
      }
      uVar7 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if ((uVar7 & 1) != 0) {
        puVar5 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                           ((UnknownFieldSet *)((uVar7 & 0xfffffffffffffffe) + 8),target,stream);
        return puVar5;
      }
      return target;
    }
    _InternalSerialize();
    pbVar6 = extraout_RAX_22;
    uVar7 = in_RCX;
LAB_00c4e42a:
    do {
      *pbVar6 = (byte)uVar7 | 0x80;
      in_RCX = uVar7 >> 7;
      pbVar6 = pbVar6 + 1;
      bVar13 = 0x3fff < uVar7;
      uVar7 = in_RCX;
    } while (bVar13);
  } while( true );
}

Assistant:

::uint8_t* PROTOBUF_NONNULL EnumParseTester::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const EnumParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.EnumParseTester)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_lowfield = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_optional_seq_small_0_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_lowfield = 2;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_0_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          2, this_._internal_repeated_seq_small_0_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_lowfield = 3 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_0_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          3, this_._internal_packed_seq_small_0_lowfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_lowfield = 4;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, this_._internal_optional_seq_small_1_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_lowfield = 5;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_1_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          5, this_._internal_repeated_seq_small_1_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_lowfield = 6 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_1_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          6, this_._internal_packed_seq_small_1_lowfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_lowfield = 7;
  if ((cached_has_bits & 0x00000080u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        7, this_._internal_optional_seq_large_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_lowfield = 8;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_large_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          8, this_._internal_repeated_seq_large_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_lowfield = 9 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_large_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          9, this_._internal_packed_seq_large_lowfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_lowfield = 10;
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        10, this_._internal_optional_arbitrary_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_lowfield = 11;
  {
    ::size_t byte_size = this_._impl_._repeated_arbitrary_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          11, this_._internal_repeated_arbitrary_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_lowfield = 12 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_arbitrary_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          12, this_._internal_packed_arbitrary_lowfield(), byte_size, target);
    }
  }

  // int32 other_field = 99;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        99, this_._internal_other_field(), target);
  }

  // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_midfield = 1001;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1001, this_._internal_optional_seq_small_0_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_midfield = 1002;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_0_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1002, this_._internal_repeated_seq_small_0_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_midfield = 1003 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_0_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1003, this_._internal_packed_seq_small_0_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_midfield = 1004;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1004, this_._internal_optional_seq_small_1_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_midfield = 1005;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_1_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1005, this_._internal_repeated_seq_small_1_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_midfield = 1006 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_1_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1006, this_._internal_packed_seq_small_1_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_midfield = 1007;
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1007, this_._internal_optional_seq_large_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_midfield = 1008;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_large_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1008, this_._internal_repeated_seq_large_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_midfield = 1009 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_large_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1009, this_._internal_packed_seq_large_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_midfield = 1010;
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1010, this_._internal_optional_arbitrary_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_midfield = 1011;
  {
    ::size_t byte_size = this_._impl_._repeated_arbitrary_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1011, this_._internal_repeated_arbitrary_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_midfield = 1012 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_arbitrary_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1012, this_._internal_packed_arbitrary_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_hifield = 1000001;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000001, this_._internal_optional_seq_small_0_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_hifield = 1000002;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_0_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000002, this_._internal_repeated_seq_small_0_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_hifield = 1000003 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_0_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000003, this_._internal_packed_seq_small_0_hifield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_hifield = 1000004;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000004, this_._internal_optional_seq_small_1_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_hifield = 1000005;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_1_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000005, this_._internal_repeated_seq_small_1_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_hifield = 1000006 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_1_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000006, this_._internal_packed_seq_small_1_hifield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_hifield = 1000007;
  if ((cached_has_bits & 0x00000800u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000007, this_._internal_optional_seq_large_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_hifield = 1000008;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_large_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000008, this_._internal_repeated_seq_large_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_hifield = 1000009 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_large_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000009, this_._internal_packed_seq_large_hifield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_hifield = 1000010;
  if ((cached_has_bits & 0x00001000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000010, this_._internal_optional_arbitrary_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_hifield = 1000011;
  {
    ::size_t byte_size = this_._impl_._repeated_arbitrary_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000011, this_._internal_repeated_arbitrary_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_hifield = 1000012 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_arbitrary_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000012, this_._internal_packed_arbitrary_hifield(), byte_size, target);
    }
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.EnumParseTester)
  return target;
}